

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

void __thiscall
JsUtil::
BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *this)

{
  undefined1 auVar1 [16];
  uint newSize;
  uint uVar2;
  hash_t hVar3;
  size_t byteSize;
  ulong dstCount;
  long lVar4;
  long lVar5;
  int *local_48;
  int *newBuckets;
  SimpleDictionaryEntry<const_std::type_info_*,_Memory::Recycler::TrackerItem_*> *pSStack_38;
  int modIndex;
  EntryType *newEntries;
  
  newSize = this->count * 2;
  newBuckets._4_4_ = 0x4b;
  uVar2 = 4;
  if (8 < newSize) {
    uVar2 = this->count & 0x7fffffff;
  }
  uVar2 = PrimePolicy::GetPrime(uVar2,(int *)((long)&newBuckets + 4));
  local_48 = (Type)0x0;
  pSStack_38 = (SimpleDictionaryEntry<const_std::type_info_*,_Memory::Recycler::TrackerItem_*> *)0x0
  ;
  dstCount = (ulong)(int)newSize;
  if (uVar2 == this->bucketCount) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = dstCount;
    byteSize = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
      byteSize = SUB168(auVar1 * ZEXT816(0x18),0);
    }
    pSStack_38 = (SimpleDictionaryEntry<const_std::type_info_*,_Memory::Recycler::TrackerItem_*> *)
                 Memory::NoCheckHeapAllocator::AllocZero(this->alloc,byteSize);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<std::type_info_const*,Memory::Recycler::TrackerItem*>,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator>
              (pSStack_38,dstCount,this->entries,(long)this->count);
    DeleteEntries(this,this->entries,this->size);
    this->entries = pSStack_38;
    this->size = newSize;
    this->modFunctionIndex = newBuckets._4_4_;
  }
  else {
    Allocate(this,&local_48,&stack0xffffffffffffffc8,uVar2,newSize);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<std::type_info_const*,Memory::Recycler::TrackerItem*>,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator>
              (pSStack_38,dstCount,this->entries,(long)this->count);
    this->modFunctionIndex = newBuckets._4_4_;
    if (0 < this->count) {
      lVar4 = 8;
      lVar5 = 0;
      do {
        if (-2 < *(int *)((long)&(pSStack_38->
                                 super_DefaultHashedEntry<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                 ).
                                 super_KeyValueEntry<const_std::type_info_*,_Memory::Recycler::TrackerItem_*>
                                 .
                                 super_ValueEntry<Memory::Recycler::TrackerItem_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_std::type_info_*,_Memory::Recycler::TrackerItem_*>_>
                                 .
                                 super_KeyValueEntryDataLayout2<const_std::type_info_*,_Memory::Recycler::TrackerItem_*>
                                 .value + lVar4)) {
          hVar3 = PrimePolicy::ModPrime
                            ((uint)(*(ulong *)((long)&(pSStack_38->
                                                                                                            
                                                  super_DefaultHashedEntry<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                                  ).
                                                  super_KeyValueEntry<const_std::type_info_*,_Memory::Recycler::TrackerItem_*>
                                                  .
                                                  super_ValueEntry<Memory::Recycler::TrackerItem_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_std::type_info_*,_Memory::Recycler::TrackerItem_*>_>
                                                  .
                                                  super_KeyValueEntryDataLayout2<const_std::type_info_*,_Memory::Recycler::TrackerItem_*>
                                                  .next + lVar4) >> 4) & 0x7fffffff,uVar2,
                             this->modFunctionIndex);
          *(int *)((long)&(pSStack_38->
                          super_DefaultHashedEntry<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                          ).
                          super_KeyValueEntry<const_std::type_info_*,_Memory::Recycler::TrackerItem_*>
                          .
                          super_ValueEntry<Memory::Recycler::TrackerItem_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_std::type_info_*,_Memory::Recycler::TrackerItem_*>_>
                          .
                          super_KeyValueEntryDataLayout2<const_std::type_info_*,_Memory::Recycler::TrackerItem_*>
                          .value + lVar4) = local_48[(int)hVar3];
          local_48[(int)hVar3] = (int)lVar5;
        }
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x18;
      } while (lVar5 < this->count);
    }
    DeleteBuckets(this,this->buckets,this->bucketCount);
    DeleteEntries(this,this->entries,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,newSize,newSize - this->size);
    }
    this->buckets = local_48;
    this->entries = pSStack_38;
    this->bucketCount = uVar2;
    this->size = newSize;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }